

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdk.cpp
# Opt level: O2

float SDK::distanceTo(Vec2 start,Vec2 end)

{
  int i;
  ulong uVar1;
  float fVar2;
  float fVar3;
  float local_38;
  float fStack_34;
  vector<Vec2,_std::allocator<Vec2>_> path;
  
  routeTo(&path,start,end);
  if (path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data._M_start
      == path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    local_38 = 1e+08;
  }
  else {
    local_38 = start.x;
    fStack_34 = start.y;
    local_38 = (path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data
               ._M_start)->x - local_38;
    fStack_34 = (path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                 super__Vector_impl_data._M_start)->y - fStack_34;
    local_38 = SQRT(local_38 * local_38 + fStack_34 * fStack_34);
    for (uVar1 = 1;
        uVar1 < (ulong)((long)path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
      fVar2 = path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar1].x -
              path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar1 - 1].x;
      fVar3 = path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar1].y -
              path.super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar1 - 1].y;
      local_38 = local_38 + SQRT(fVar2 * fVar2 + fVar3 * fVar3);
    }
  }
  std::_Vector_base<Vec2,_std::allocator<Vec2>_>::~_Vector_base
            (&path.super__Vector_base<Vec2,_std::allocator<Vec2>_>);
  return local_38;
}

Assistant:

float SDK::distanceTo(Vec2 start, Vec2 end)
{
    auto path = routeTo(start, end);
    if (path.empty())
        return FINF;
    float res = (path[0] - start).length();
    for (int i = 1; i < path.size(); ++i)
        res += (path[i] - path[i - 1]).length();
    return res;
}